

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VarianceSwapsHestonAnalyticalPricer.cpp
# Opt level: O0

double __thiscall
VarianceSwapsHestonAnalyticalPricer::u1Term
          (VarianceSwapsHestonAnalyticalPricer *this,double t1,double t2)

{
  double dVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  complex<double> local_128;
  undefined1 local_118 [8];
  complex<double> u1;
  undefined1 local_f8 [8];
  complex<double> thirdTerm;
  complex<double> local_e0;
  complex<double> local_d0;
  complex<double> local_c0;
  undefined1 local_b0 [8];
  complex<double> secondTerm;
  complex<double> local_90;
  undefined1 local_80 [8];
  complex<double> firstTerm;
  complex<double> D2;
  complex<double> D1;
  complex<double> C2;
  complex<double> C1;
  double v0;
  double delta;
  double t2_local;
  double t1_local;
  VarianceSwapsHestonAnalyticalPricer *this_local;
  
  dVar1 = t2 - t1;
  C1._M_value._8_8_ = HestonModel::getInitialVolatility(this->hestonModel_);
  uVar2 = 0;
  uVar3 = 0;
  functionCPrime(this,dVar1,0.0);
  C1._M_value._4_4_ = uVar3;
  C1._M_value._0_4_ = uVar2;
  uVar2 = 0;
  uVar3 = 0;
  functionCSecond(this,dVar1,0.0);
  C2._M_value._4_4_ = uVar3;
  C2._M_value._0_4_ = uVar2;
  uVar2 = 0;
  uVar3 = 0;
  functionDPrime(this,dVar1,0.0);
  D1._M_value._4_4_ = uVar3;
  D1._M_value._0_4_ = uVar2;
  uVar2 = 0;
  uVar3 = 0;
  functionDSecond(this,dVar1,0.0);
  D2._M_value._4_4_ = uVar3;
  D2._M_value._0_4_ = uVar2;
  std::operator*((complex<double> *)(D2._M_value + 8),(complex<double> *)(D2._M_value + 8));
  std::operator*((complex<double> *)(secondTerm._M_value + 8),(double *)(C1._M_value + 8));
  local_90._M_value._12_4_ = uVar3;
  local_90._M_value._8_4_ = uVar2;
  std::operator*(&local_90,(double *)(C1._M_value + 8));
  firstTerm._M_value._4_4_ = uVar3;
  firstTerm._M_value._0_4_ = uVar2;
  thirdTerm._M_value._8_8_ = 0x4000000000000000;
  std::operator*((double *)(thirdTerm._M_value + 8),(complex<double> *)(C2._M_value + 8));
  local_e0._M_value._12_4_ = uVar3;
  local_e0._M_value._8_4_ = uVar2;
  std::operator*(&local_e0,(complex<double> *)(D2._M_value + 8));
  local_d0._M_value._12_4_ = uVar3;
  local_d0._M_value._8_4_ = uVar2;
  std::operator-(&local_d0,(complex<double> *)(firstTerm._M_value + 8));
  local_c0._M_value._12_4_ = uVar3;
  local_c0._M_value._8_4_ = uVar2;
  std::operator*((double *)(C1._M_value + 8),&local_c0);
  secondTerm._M_value._4_4_ = uVar3;
  secondTerm._M_value._0_4_ = uVar2;
  std::operator*((complex<double> *)(C2._M_value + 8),(complex<double> *)(C2._M_value + 8));
  std::operator-((complex<double> *)(u1._M_value + 8),(complex<double> *)(D1._M_value + 8));
  thirdTerm._M_value._4_4_ = uVar3;
  thirdTerm._M_value._0_4_ = uVar2;
  std::operator+((complex<double> *)local_80,(complex<double> *)local_b0);
  local_128._M_value._12_4_ = uVar3;
  local_128._M_value._8_4_ = uVar2;
  std::operator+(&local_128,(complex<double> *)local_f8);
  u1._M_value._4_4_ = uVar3;
  u1._M_value._0_4_ = uVar2;
  dVar1 = std::complex<double>::real_abi_cxx11_((complex<double> *)local_118);
  return dVar1;
}

Assistant:

double VarianceSwapsHestonAnalyticalPricer::
u1Term(double t1, double t2) const {
    double delta = t2-t1,
           v0 = hestonModel_->getInitialVolatility();
    std::complex<double> C1 = functionCPrime(delta,0.),
                        C2 = functionCSecond(delta,0.),
                        D1 = functionDPrime(delta,0.),
                        D2 = functionDSecond(delta,0.);
    std::complex<double> firstTerm = D1*D1*v0*v0,
                        secondTerm = v0*(2.0*C1*D1-D2),
                        thirdTerm = C1*C1 - C2;
    std::complex<double> u1 = firstTerm+secondTerm+thirdTerm; 
    return u1.real();
}